

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double poisson_cdf(int k,double a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (a <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"POISSON_CDF - Fatal error!\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  A <= 0.\n",10);
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    if ((-1 < k) && (dVar1 = exp(-a), dVar3 = dVar1, k != 0)) {
      dVar2 = 1.0;
      do {
        dVar1 = (dVar1 * a) / dVar2;
        dVar3 = dVar3 + dVar1;
        dVar2 = dVar2 + 1.0;
        k = k + -1;
      } while (k != 0);
    }
  }
  return dVar3;
}

Assistant:

double poisson_cdf ( int k, double a )

//****************************************************************************80
//
//  Purpose:
//
//    POISSON_CDF evaluates the Poisson CDF.
//
//  Discussion:
//
//    CDF(K,A) is the probability that the number of events observed
//    in a unit time period will be no greater than K, given that the
//    expected number of events in a unit time period is A.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 January 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int K, the argument of the CDF.
//
//    Input, double A, the parameter of the PDF.
//    0 < A.
//
//    Output, double POISSON_CDF, the value of the CDF.
//
{
  double cdf;
  int i;
  double last;
  double next;
//
//  Check.
//
  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "POISSON_CDF - Fatal error!\n";
    cerr << "  A <= 0.\n";
    return 0;
  }
//
//  Special cases.
//
  if ( k < 0 )
  {
    cdf = 0.0;
    return cdf;
  }
//
//  General case.
//
  next = exp ( - a );
  cdf = next;

  for ( i = 1; i <= k; i++ )
  {
    last = next;
    next = last * a / static_cast< double > ( i);
    cdf = cdf + next;
  }

  return cdf;
}